

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::plot_implicit(Plotter *this,size_t funcid)

{
  _Head_base<1UL,_int,_false> _Var1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  bool bVar5;
  pointer ptVar6;
  pointer ptVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  allocator_type *paVar11;
  allocator_type *paVar12;
  uint uVar13;
  _Head_base<3UL,_int,_false> _Var14;
  uint uVar15;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_00;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_01;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_02;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_03;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_04;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  pointer pFVar20;
  long lVar21;
  _Head_base<3UL,_int,_false> _Var22;
  ulong uVar23;
  allocator_type *paVar24;
  ulong uVar25;
  _Head_base<4UL,_double,_false> _Var26;
  float in_XMM4_Da;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  vector<bool,_std::allocator<bool>_> coarse_below_interesting;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  interest_squares;
  anon_class_48_6_f4d7eaea_for__M_head_impl worker;
  vector<double,_std::allocator<double>_> coarse_line;
  atomic<int> sqr_id;
  color ineq_color;
  vector<std::thread,_std::allocator<std::thread>_> local_178;
  double local_158;
  float local_150;
  float local_14c;
  int local_148;
  int local_144;
  vector<bool,_std::allocator<bool>_> local_140;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  local_118;
  pointer local_f8;
  View *local_f0;
  color *local_e8;
  undefined1 local_e0 [8];
  undefined8 local_d8;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  *local_d0;
  pointer local_c8;
  color **local_c0;
  color *local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *local_98;
  ulong local_90;
  ulong local_88;
  Environment *local_80;
  Expr *local_78;
  double local_70;
  atomic<int> local_64;
  color local_60;
  anon_class_48_6_f4d7eaea_for__M_head_impl *__args;
  
  pFVar20 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_78 = &pFVar20[funcid].expr;
  local_e8 = (color *)funcid;
  bVar8 = Expr::is_null(local_78);
  if ((!bVar8) &&
     ((pFVar20 = pFVar20 + funcid,
      ((pFVar20->expr).ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start)->opcode != 1 || (pFVar20->type != 0x10)))) {
    color::color::color(&local_60,&pFVar20->line_color);
    *local_60.a = 0.25;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_b0,(long)(this->view).swid + 2,(allocator_type *)local_e0);
    local_e0 = (undefined1  [8])((ulong)local_e0 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_140,(long)(this->view).swid + 2,(bool *)local_e0,(allocator_type *)&local_118)
    ;
    local_118.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __args = extraout_RDX;
    local_f8 = pFVar20;
    if (plot_implicit(unsigned_long)::HIGH_PIX_LIMIT == '\0') {
      plot_implicit();
      __args = extraout_RDX_04;
    }
    iVar19 = (this->view).shigh;
    if (-4 < iVar19) {
      local_f0 = &this->view;
      local_80 = &this->env;
      local_98 = &this->draw_buf;
      local_90 = 0x800000000000003f;
      local_88 = 0x8000000000000000;
      uVar10 = 0xffffffff;
      do {
        uVar15 = 4;
        _Var1._M_head_impl = uVar10;
        if (iVar19 <= (int)uVar10) {
          _Var1._M_head_impl = iVar19 - 1;
          uVar10 = iVar19 + 2;
          if (-1 < _Var1._M_head_impl) {
            uVar10 = _Var1._M_head_impl;
          }
          uVar15 = _Var1._M_head_impl - (uVar10 & 0xfffffffc);
          __args = (anon_class_48_6_f4d7eaea_for__M_head_impl *)(ulong)uVar15;
          if (uVar15 == 0) break;
        }
        iVar9 = (this->view).swid;
        if (-4 < iVar9) {
          local_70 = (this->view).ymin;
          local_70 = (((this->view).ymax - local_70) * (double)(iVar19 - _Var1._M_head_impl)) /
                     (double)iVar19 + local_70;
          local_144 = uVar15 - 1;
          local_14c = (float)(int)(1 - uVar15) + (float)_Var1._M_head_impl;
          local_150 = (float)(int)uVar15;
          local_148 = _Var1._M_head_impl - uVar15;
          _Var14._M_head_impl = 0xffffffff;
          bVar8 = false;
          do {
            iVar19 = 4;
            if (_Var14._M_head_impl < iVar9) {
LAB_00141f26:
              dVar2 = (this->view).xmax;
              dVar3 = (this->view).xmin;
              pdVar4 = (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar4[this->y_var] = local_70;
              pdVar4[this->x_var] =
                   ((dVar2 - dVar3) * (double)_Var14._M_head_impl) / (double)iVar9 + dVar3;
              _Var26._M_head_impl = Expr::operator()(local_78,local_80);
              lVar21 = (long)_Var14._M_head_impl;
              if ((iVar19 + -1 <= _Var14._M_head_impl) && (local_144 <= _Var1._M_head_impl)) {
                uVar10 = -(uint)(_Var26._M_head_impl != 0.0) & 1;
                if (_Var26._M_head_impl < 0.0) {
                  uVar10 = 0xffffffff;
                }
                uVar16 = lVar21 + 1;
                uVar25 = lVar21 + 0x40;
                if (-1 < (long)uVar16) {
                  uVar25 = uVar16;
                }
                lVar17 = (long)uVar25 >> 6;
                uVar15 = _Var14._M_head_impl + 1;
                uVar23 = (ulong)((uVar16 & local_90) <= local_88);
                uVar18 = 1L << ((byte)uVar15 & 0x3f);
                uVar25 = local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [lVar17 + (uVar23 - 1)];
                local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar17 + (uVar23 - 1)] = uVar25 & ~(1L << ((ulong)uVar15 & 0x3f));
                uVar13 = -(uint)(local_b0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(int)(uVar15 - iVar19)] !=
                                0.0) & 1;
                if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)(uVar15 - iVar19)] < 0.0) {
                  uVar13 = 0xffffffff;
                }
                if ((int)(uVar13 * uVar10) < 1) {
                  local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [lVar17 + (uVar23 - 1)] = uVar25 | uVar18;
                }
                uVar15 = -(uint)(local_b0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar16] != 0.0) & 1;
                if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar16] < 0.0) {
                  uVar15 = 0xffffffff;
                }
                bVar5 = (int)(uVar15 * uVar10) < 1;
                if (((((uVar25 & uVar18) != 0) || ((int)(uVar13 * uVar10) < 1)) ||
                    ((int)(uVar15 * uVar10) < 1)) || (bVar8)) {
                  local_d8 = (atomic<int> *)
                             CONCAT44(_Var14._M_head_impl - iVar19,_Var14._M_head_impl);
                  local_d0 = (vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                              *)CONCAT44(local_148,_Var1._M_head_impl);
                  local_158 = _Var26._M_head_impl;
                  local_e0 = (undefined1  [8])_Var26._M_head_impl;
                  std::
                  vector<std::tuple<int,int,int,int,double>,std::allocator<std::tuple<int,int,int,int,double>>>
                  ::emplace_back<std::tuple<int,int,int,int,double>>
                            ((vector<std::tuple<int,int,int,int,double>,std::allocator<std::tuple<int,int,int,int,double>>>
                              *)&local_118,(tuple<int,_int,_int,_int,_double> *)local_e0);
                  _Var26._M_head_impl = local_158;
                  bVar8 = bVar5;
                }
                else {
                  bVar8 = bVar5;
                  if ((0.0 <= _Var26._M_head_impl) && (local_f8->type != 0x10)) {
                    local_158 = _Var26._M_head_impl;
                    anon_unknown_1::buf_add_screen_rectangle
                              (local_98,local_f0,(float)(1 - iVar19) + (float)_Var14._M_head_impl,
                               local_14c,(float)iVar19,local_150,SUB81(&local_60,0),local_e8,
                               in_XMM4_Da,uVar25);
                    _Var26._M_head_impl = local_158;
                  }
                }
              }
              local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21 + 1] = _Var26._M_head_impl;
              bVar5 = true;
              _Var22._M_head_impl = _Var14._M_head_impl;
            }
            else {
              _Var14._M_head_impl = iVar9 - 1;
              uVar10 = iVar9 + 2;
              if (-1 < _Var14._M_head_impl) {
                uVar10 = _Var14._M_head_impl;
              }
              iVar19 = _Var14._M_head_impl - (uVar10 & 0xfffffffc);
              if (iVar19 != 0) goto LAB_00141f26;
              bVar5 = false;
              _Var22._M_head_impl = _Var14._M_head_impl;
            }
            if (!bVar5) break;
            _Var14._M_head_impl = _Var22._M_head_impl + 4;
            iVar9 = local_f0->swid;
          } while ((int)(_Var22._M_head_impl + 1U) < iVar9);
        }
        uVar10 = _Var1._M_head_impl + 4;
        iVar19 = (this->view).shigh;
        __args = (anon_class_48_6_f4d7eaea_for__M_head_impl *)(ulong)(_Var1._M_head_impl + 1U);
      } while ((int)(_Var1._M_head_impl + 1U) < iVar19);
    }
    local_d8 = &local_64;
    local_64.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    local_d0 = &local_118;
    local_c8 = local_f8;
    local_c0 = &local_e8;
    local_b8 = &local_60;
    local_e0 = (undefined1  [8])this;
    if ((anonymous_namespace)::NUM_THREADS < 2) {
      std::
      _Head_base<0UL,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/sxyu[P]nivalis/src/plotter/render.cpp:640:19),_false>
      ::anon_class_48_6_f4d7eaea_for__M_head_impl::operator()
                ((anon_class_48_6_f4d7eaea_for__M_head_impl *)local_e0);
    }
    else {
      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((anonymous_namespace)::NUM_THREADS != 0) {
        uVar16 = 0;
        do {
          ptVar7 = local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar6 = local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            if ((long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar23 = (long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            uVar18 = uVar23 + (uVar23 == 0);
            uVar25 = uVar18 + uVar23;
            if (0xffffffffffffffe < uVar25) {
              uVar25 = 0xfffffffffffffff;
            }
            if (CARRY8(uVar18,uVar23)) {
              uVar25 = 0xfffffffffffffff;
            }
            if (uVar25 == 0) {
              paVar11 = (allocator_type *)0x0;
            }
            else {
              paVar11 = (allocator_type *)
                        __gnu_cxx::new_allocator<std::thread>::allocate
                                  ((new_allocator<std::thread> *)&local_178,uVar25,(void *)0x0);
              __args = extraout_RDX_01;
            }
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                      (paVar11 + uVar23 * 8,(thread *)local_e0,__args);
            paVar24 = paVar11;
            for (paVar12 = (allocator_type *)ptVar6; paVar12 != (allocator_type *)ptVar7;
                paVar12 = paVar12 + 8) {
              *(id *)paVar24 = (id)0x0;
              *(native_handle_type *)paVar24 = (native_handle_type)*(id *)paVar12;
              *(id *)paVar12 = (id)0x0;
              paVar24 = paVar24 + 8;
            }
            __args = extraout_RDX_02;
            if ((allocator_type *)ptVar6 != (allocator_type *)0x0) {
              operator_delete(ptVar6,(long)local_178.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)ptVar6);
              __args = extraout_RDX_03;
            }
            local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(paVar11 + uVar25 * 8);
            local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)paVar11;
          }
          else {
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                      ((allocator_type *)
                       local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(thread *)local_e0,__args);
            __args = extraout_RDX_00;
            paVar24 = (allocator_type *)
                      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(paVar24 + 8);
          uVar16 = uVar16 + 1;
        } while (uVar16 < (anonymous_namespace)::NUM_THREADS);
      }
      if (local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar16 = 0;
        do {
          std::thread::join();
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)local_178.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_178.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_178);
    }
    if (local_118.
        super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Plotter::plot_implicit(size_t funcid) {
    auto& func = funcs[funcid];
    // Implicit function
    if (func.expr.is_null() ||
            (func.expr.ast[0].opcode == OpCode::val &&
             func.type == Function::FUNC_TYPE_IMPLICIT)) {
        // Either 0=0 or c=0 for some c, do not draw
        return;
    }

    // Inequality color
    color::color ineq_color = get_ineq_color(func.line_color);

    // Coarse interval
    static const int COARSE_INTERVAL = 4;

    // Function values in above line
    std::vector<double> coarse_line(view.swid + 2);

    // 'Interesting' squares from above line/to left
    // When a square is painted, need to paint neighbor
    // to below (if changes sign left)/
    // right (if changes sign above) as well
    std::vector<bool> coarse_below_interesting(view.swid + 2);
    bool coarse_right_interesting = false;

    // Interesting squares
    using Square = std::tuple<int, int, int, int, double>;
    std::vector<Square> interest_squares;

    // Increase interval per x pixels
    static const size_t HIGH_PIX_LIMIT =
        std::max<size_t>(200000 / NUM_THREADS, 20000);
    // Maximum number of pixels to draw (stops drawing)
    static const size_t MAX_PIXELS = 300000;
    // Epsilon for bisection
    static const double BISECTION_EPS = 1e-4;

    for (int csy = -1; csy < view.shigh + COARSE_INTERVAL - 1; csy += COARSE_INTERVAL) {
        int cyi = COARSE_INTERVAL;
        if (csy >= view.shigh) {
            csy = view.shigh - 1;
            cyi = (view.shigh-1) % COARSE_INTERVAL;
            if (cyi == 0) break;
        }
        const double cy = _SY_TO_Y(csy);
        coarse_right_interesting = false;
        for (int csx = -1; csx < view.swid + COARSE_INTERVAL - 1; csx += COARSE_INTERVAL) {
            int cxi = COARSE_INTERVAL;
            if (csx >= view.swid) {
                csx = view.swid - 1;
                cxi = (view.swid-1) % COARSE_INTERVAL;
                if (cxi == 0) break;
            }
            // Update interval based on point count
            const double coarse_x = _SX_TO_X(csx);
            double precise_x = coarse_x, precise_y = cy;
            const int xy_pos = csy * view.swid + csx;

            env.vars[y_var] = cy;
            env.vars[x_var] = coarse_x;
            double z = func.expr(env);
            if (csx >= cxi-1 && csy >= cyi-1) {
                bool interesting_square = false;
                int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                bool interest_from_left = coarse_right_interesting;
                bool interest_from_above = coarse_below_interesting[csx+1];
                coarse_right_interesting = coarse_below_interesting[csx+1] = false;
                double zleft = coarse_line[csx+1 - cxi];
                int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                if (sgn_zleft * sgn_z <= 0) {
                    coarse_below_interesting[csx+1] = true;
                    interesting_square = true;
                }
                double zup = coarse_line[csx+1];
                int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                if (sgn_zup * sgn_z <= 0) {
                    coarse_right_interesting = true;
                    interesting_square = true;
                }
                if (interesting_square || interest_from_left ||
                        interest_from_above) {
                    interest_squares.push_back(Square(
                                csy - cyi, csy, csx - cxi, csx, z));
                } else if (sgn_z >= 0 &&
                        func.type !=
                        Function::FUNC_TYPE_IMPLICIT) {
                    // Inequality region
                    buf_add_screen_rectangle(draw_buf, view,
                            csx + (float)(- cxi + 1),
                            csy + (float)(- cyi + 1),
                            (float)cxi, (float)cyi,
                            true, ineq_color, 0.0, funcid);
                }
            }
            coarse_line[csx+1] = z;
        }
    }

#ifndef NIVALIS_EMSCRIPTEN
    std::atomic<int> sqr_id(0);
#else
    int sqr_id(0);
#endif
    auto worker = [&]() {
        std::vector<double> line(view.swid + 2);
        std::vector<bool> fine_paint_below(view.swid + 2);
        std::vector<std::array<int, 3> > tdraws, tdraws_ineq;
        std::vector<PointMarker> tpt_markers;
        Environment tenv = env;
        bool fine_paint_right;
        // Number of pixels drawn, used to increase fine interval
        size_t tpix_cnt = 0;
        // Fine interval (variable)
        int fine_interval = 1;
        while (true) {
            int i = sqr_id++;
            if (i >= interest_squares.size()) break;
            auto& sqr = interest_squares[i];

            if (tpix_cnt > MAX_PIXELS) break;
            // Update interval based on point count
            fine_interval = static_cast<int>(tpix_cnt /
                    HIGH_PIX_LIMIT) + 1;
            if (fine_interval >= 3) fine_interval = 4;

            int ylo, yhi, xlo, xhi; double z_at_xy_hi;
            std::tie(ylo, yhi, xlo, xhi, z_at_xy_hi) = sqr;

            std::fill(fine_paint_below.begin() + (xlo + 1),
                    fine_paint_below.begin() + (xhi + 2), false);
            for (int sy = ylo; sy <= yhi; sy += fine_interval) {
                fine_paint_right = false;
                const double y = _SY_TO_Y(sy);
                for (int sx = xlo; sx <= xhi; sx += fine_interval) {

                    const double x = _SX_TO_X(sx);
                    double z;
                    if (sy == yhi && sx == xhi) {
                        z = z_at_xy_hi;
                    } else {
                        tenv.vars[y_var] = y;
                        tenv.vars[x_var] = x;
                        z = func.expr(tenv);
                    }
                    if (sy > ylo && sx > xlo) {
                        int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                        bool paint_square = false;
                        bool paint_from_left = fine_paint_right;
                        bool paint_from_above = fine_paint_below[sx+1];
                        fine_paint_right = fine_paint_below[sx+1] = false;
                        double zup = line[sx+1];
                        int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                        if (sgn_zup * sgn_z <= 0) {
                            //     // Bisect up
                            //     tenv.vars[x_var] = x;
                            //     double lo = y;
                            //     double hi = (view.shigh - (sy - fine_interval))*1. / view.shigh * ydiff + view.ymin;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[y_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_z == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_y = lo;
                            paint_square = fine_paint_right = true;
                        }
                        double zleft = line[sx+1 - fine_interval];
                        int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                        if (sgn_zleft * sgn_z <= 0) {
                            // if (!paint_square) {
                            //     // Bisect left
                            //     tenv.vars[y_var] = y;
                            //     double lo = 1.*(sx - fine_interval) / view.swid * xdiff + view.xmin;
                            //     double hi = x;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[x_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_zleft == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_x = lo;
                            // }
                            paint_square = fine_paint_below[sx+1] = true;
                        }
                        if (paint_square || paint_from_left || paint_from_above) {
                            // float precise_sy =
                            //     static_cast<float>(
                            //             (view.ymax - y) / ydiff * view.shigh);
                            // float precise_sx = static_cast<float>(
                            //         (x - view.xmin) / xdiff * view.swid);
                            tdraws.push_back({sx, sy, fine_interval});
                            ++tpix_cnt;
                        } else if (sgn_z >= 0 &&
                                func.type !=
                                Function::FUNC_TYPE_IMPLICIT) {
                            // Inequality region
                            tdraws_ineq.push_back({sx, sy, fine_interval});
                        }
                    }
                    line[sx+1] = z;
                }
            }
        }

        {
#ifndef NIVALIS_EMSCRIPTEN
            std::lock_guard<std::mutex> lock(mtx);
#endif
            if ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                // Draw function line (boundary)
                for (auto& p : tdraws) {
                    buf_add_screen_rectangle(draw_buf, view,
                            p[0] + (float)(- p[2] + 1),
                            p[1] + (float)(- p[2] + 1),
                            (float)(p[2]),
                            (float)(p[2]),
                            true, func.line_color, 0.0, funcid);
                }
            }
            for (auto& p : tdraws_ineq) {
                // Draw inequality region
                buf_add_screen_rectangle(draw_buf, view,
                        p[0] + (float)(- p[2] + 1),
                        p[1] + (float)(- p[2] + 1),
                        (float)p[2],
                        (float)p[2],
                        true,
                        ineq_color, 0.0, funcid);
            }

            size_t sz = pt_markers.size();
            pt_markers.resize(sz + tpt_markers.size());
            std::move(tpt_markers.begin(), tpt_markers.end(),
                    pt_markers.begin() + sz);

            // Show detail lost warning
            if (fine_interval > 1) loss_detail = true;
        }
    };

#ifndef NIVALIS_EMSCRIPTEN
    if (NUM_THREADS <= 1) {
        worker();
    } else {
        std::vector<std::thread> pool;
        for (size_t i = 0; i < NUM_THREADS; ++i) {
            pool.emplace_back(worker);
        }
        for (size_t i = 0; i < pool.size(); ++i) pool[i].join();
    }
#else
    worker();
#endif
}